

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_ObjDelay(Gia_Man_t *pNew,int iObj,int nLutSize,Vec_Int_t *vDelay)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  if ((iObj < 0) || (iVar8 = vDelay->nSize, iVar8 <= iObj)) goto LAB_0076c102;
  piVar2 = vDelay->pArray;
  iVar9 = piVar2[(uint)iObj];
  if (iVar9 == 0) {
    puVar3 = pNew->pMuxes;
    if ((puVar3 == (uint *)0x0) || (puVar3[(uint)iObj] == 0)) {
      if (pNew->nObjs <= iObj) goto LAB_0076c121;
      uVar5 = iObj - ((uint)*(undefined8 *)(pNew->pObjs + (uint)iObj) & 0x1fffffff);
      if (((((int)uVar5 < 0) || (iVar8 <= (int)uVar5)) ||
          (uVar7 = iObj - ((uint)((ulong)*(undefined8 *)(pNew->pObjs + (uint)iObj) >> 0x20) &
                          0x1fffffff), (int)uVar7 < 0)) || (iVar8 <= (int)uVar7)) goto LAB_0076c102;
      iVar9 = piVar2[uVar5] >> 4;
      iVar11 = piVar2[uVar7] >> 4;
      uVar5 = piVar2[uVar5] & 0xf;
      iVar8 = iVar11;
      if (iVar11 < iVar9) {
        iVar8 = iVar9;
      }
      if (iVar9 < iVar11) {
        uVar5 = 1;
      }
      uVar7 = piVar2[uVar7] & 0xf;
      if (iVar11 < iVar9) {
        uVar7 = 1;
      }
      iVar9 = 0x12;
      if ((int)(uVar7 + uVar5) <= nLutSize) {
        iVar9 = uVar7 + uVar5;
      }
      iVar9 = iVar9 + iVar8 * 0x10;
    }
    else {
      if (pNew->nObjs <= iObj) {
LAB_0076c121:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar5 = iObj - ((uint)*(undefined8 *)(pNew->pObjs + (uint)iObj) & 0x1fffffff);
      if ((((int)uVar5 < 0) || (iVar8 <= (int)uVar5)) ||
         ((uVar7 = iObj - ((uint)((ulong)*(undefined8 *)(pNew->pObjs + (uint)iObj) >> 0x20) &
                          0x1fffffff), (int)uVar7 < 0 || (iVar8 <= (int)uVar7)))) {
LAB_0076c102:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = 0xffffffff;
      if (puVar3 != (uint *)0x0) {
        uVar1 = puVar3[(uint)iObj];
        if (uVar1 != 0) {
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar10 = uVar1 >> 1;
        }
      }
      if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_0076c102;
      iVar9 = piVar2[uVar5] >> 4;
      iVar11 = piVar2[uVar7] >> 4;
      iVar8 = iVar11;
      if (iVar11 < iVar9) {
        iVar8 = iVar9;
      }
      iVar6 = piVar2[uVar10] >> 4;
      iVar4 = iVar6;
      if (iVar6 < iVar8) {
        iVar4 = iVar8;
      }
      uVar5 = piVar2[uVar5] & 0xf;
      if (iVar4 != iVar9) {
        uVar5 = 1;
      }
      uVar7 = piVar2[uVar7] & 0xf;
      if (iVar4 != iVar11) {
        uVar7 = 1;
      }
      uVar10 = piVar2[uVar10] & 0xf;
      if (iVar6 < iVar8) {
        uVar10 = 1;
      }
      iVar8 = uVar10 + uVar7 + uVar5;
      iVar9 = 0x13;
      if (iVar8 <= nLutSize) {
        iVar9 = iVar8;
      }
      iVar9 = iVar9 + iVar4 * 0x10;
    }
    piVar2[(uint)iObj] = iVar9;
  }
  return iVar9;
}

Assistant:

static inline int Str_ObjDelay( Gia_Man_t * pNew, int iObj, int nLutSize, Vec_Int_t * vDelay )
{
    int Delay = Vec_IntEntry( vDelay, iObj );
    if ( Delay == 0 )
    {
        if ( Gia_ObjIsMuxId(pNew, iObj) )
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            int d2 = Vec_IntEntry( vDelay, Gia_ObjFaninId2(pNew, iObj) );
            Delay = Str_Delay3( d0, d1, d2, nLutSize );
        }
        else
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            Delay = Str_Delay2( d0, d1, nLutSize );
        }
        Vec_IntWriteEntry( vDelay, iObj, Delay );
    }
    return Delay;
}